

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::safe_pop(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           *this)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> in_RDI;
  priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  *unaff_retaddr;
  iterator e;
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  *in_stack_ffffffffffffffb8;
  _Hash_node_value<std::pair<const_int,_bool>,_false> *this_00;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_20;
  index_t local_14;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_10 [2];
  
  if (((ulong)in_RDI._M_cur[9].super__Hash_node_base._M_nxt & 1) != 0) {
    this_00 = &in_RDI._M_cur[5].super__Hash_node_value<std::pair<const_int,_bool>,_false>;
    std::
    priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
    ::top((priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           *)0x1cf5b6);
    local_14 = get_index((filtration_entry_t *)0x1cf5be);
    local_10[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x1cf5d1);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator!=(local_10,&local_20);
    if (bVar1) {
      std::
      unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
      ::erase((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
               *)this_00,(iterator)in_RDI._M_cur);
    }
  }
  std::
  priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  ::pop(unaff_retaddr);
  return;
}

Assistant:

inline void safe_pop() {
		if (use_dense_version) {
			auto e =
			    coefficients.find(get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()));
			if (e != coefficients.end()) coefficients.erase(e);
		}
		std::priority_queue<filtration_entry_t, Container, Comparator>::pop();
	}